

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeGetPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,int noContent,int bReadonly)

{
  MemPage *pMVar1;
  uint uVar2;
  DbPage *pDStack_40;
  int flags;
  DbPage *pDbPage;
  int local_30;
  int rc;
  int bReadonly_local;
  int noContent_local;
  MemPage **ppPage_local;
  BtShared *pBStack_18;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  uVar2 = 0;
  if (bReadonly != 0) {
    uVar2 = 2;
  }
  local_30 = bReadonly;
  rc = noContent;
  _bReadonly_local = ppPage;
  ppPage_local._4_4_ = pgno;
  pBStack_18 = pBt;
  pDbPage._4_4_ =
       sqlite3PagerAcquire(pBt->pPager,pgno,&stack0xffffffffffffffc0,noContent != 0 | uVar2);
  pBt_local._4_4_ = pDbPage._4_4_;
  if (pDbPage._4_4_ == 0) {
    pMVar1 = btreePageFromDbPage(pDStack_40,ppPage_local._4_4_,pBStack_18);
    *_bReadonly_local = pMVar1;
    pBt_local._4_4_ = 0;
  }
  return pBt_local._4_4_;
}

Assistant:

static int btreeGetPage(
  BtShared *pBt,       /* The btree */
  Pgno pgno,           /* Number of the page to fetch */
  MemPage **ppPage,    /* Return the page in this parameter */
  int noContent,       /* Do not load page content if true */
  int bReadonly        /* True if a read-only (mmap) page is ok */
){
  int rc;
  DbPage *pDbPage;
  int flags = (noContent ? PAGER_ACQUIRE_NOCONTENT : 0) 
            | (bReadonly ? PAGER_ACQUIRE_READONLY : 0);

  assert( noContent==0 || bReadonly==0 );
  assert( sqlite3_mutex_held(pBt->mutex) );
  rc = sqlite3PagerAcquire(pBt->pPager, pgno, (DbPage**)&pDbPage, flags);
  if( rc ) return rc;
  *ppPage = btreePageFromDbPage(pDbPage, pgno, pBt);
  return SQLITE_OK;
}